

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

int32_t res_countArrayItems_63(ResourceData *pResData,Resource res)

{
  uint uVar1;
  uint local_30;
  uint local_2c;
  uint32_t offset;
  Resource res_local;
  ResourceData *pResData_local;
  
  uVar1 = res & 0xfffffff;
  switch(res >> 0x1c) {
  case 0:
  case 1:
  case 3:
  case 6:
  case 7:
  case 0xe:
    pResData_local._4_4_ = 1;
    break;
  case 2:
    if (uVar1 == 0) {
      local_30 = 0;
    }
    else {
      local_30 = (uint)*(ushort *)(pResData->pRoot + uVar1);
    }
    pResData_local._4_4_ = local_30;
    break;
  case 4:
  case 8:
    if (uVar1 == 0) {
      local_2c = 0;
    }
    else {
      local_2c = pResData->pRoot[uVar1];
    }
    pResData_local._4_4_ = local_2c;
    break;
  case 5:
  case 9:
    pResData_local._4_4_ = (uint)pResData->p16BitUnits[uVar1];
    break;
  default:
    pResData_local._4_4_ = 0;
  }
  return pResData_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
res_countArrayItems(const ResourceData *pResData, Resource res) {
    uint32_t offset=RES_GET_OFFSET(res);
    switch(RES_GET_TYPE(res)) {
    case URES_STRING:
    case URES_STRING_V2:
    case URES_BINARY:
    case URES_ALIAS:
    case URES_INT:
    case URES_INT_VECTOR:
        return 1;
    case URES_ARRAY:
    case URES_TABLE32:
        return offset==0 ? 0 : *(pResData->pRoot+offset);
    case URES_TABLE:
        return offset==0 ? 0 : *((const uint16_t *)(pResData->pRoot+offset));
    case URES_ARRAY16:
    case URES_TABLE16:
        return pResData->p16BitUnits[offset];
    default:
        return 0;
    }
}